

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqclass.cpp
# Opt level: O0

void __thiscall
SQInstance::SQInstance(SQInstance *this,SQSharedState *ss,SQClass *c,SQInteger memsize)

{
  SQUnsignedInteger SVar1;
  SQClassMember *o;
  SQObjectPtr *local_50;
  SQUnsignedInteger local_48;
  SQUnsignedInteger n;
  SQUnsignedInteger nvalues;
  SQInteger memsize_local;
  SQClass *c_local;
  SQSharedState *ss_local;
  SQInstance *this_local;
  
  SQDelegable::SQDelegable(&this->super_SQDelegable);
  (this->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted =
       (_func_int **)&PTR__SQInstance_0015ff58;
  local_50 = this->_values;
  do {
    ::SQObjectPtr::SQObjectPtr(local_50);
    local_50 = local_50 + 1;
  } while ((SQInstance *)local_50 != this + 1);
  this->_memsize = memsize;
  this->_class = c;
  SVar1 = sqvector<SQClassMember>::size(&this->_class->_defaultvalues);
  for (local_48 = 0; local_48 < SVar1; local_48 = local_48 + 1) {
    o = sqvector<SQClassMember>::operator[](&this->_class->_defaultvalues,local_48);
    ::SQObjectPtr::SQObjectPtr(this->_values + local_48,&o->val);
  }
  Init(this,ss);
  return;
}

Assistant:

SQInstance::SQInstance(SQSharedState *ss, SQClass *c, SQInteger memsize)
{
    _memsize = memsize;
    _class = c;
    SQUnsignedInteger nvalues = _class->_defaultvalues.size();
    for(SQUnsignedInteger n = 0; n < nvalues; n++) {
        new (&_values[n]) SQObjectPtr(_class->_defaultvalues[n].val);
    }
    Init(ss);
}